

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rcc.cpp
# Opt level: O0

void __thiscall RCCResourceLibrary::writeNumber4(RCCResourceLibrary *this,quint32 number)

{
  undefined4 in_ESI;
  long in_RDI;
  quint8 tmp;
  undefined4 in_stack_fffffffffffffff0;
  
  if (*(int *)(in_RDI + 400) == 3) {
    QIODevice::putChar((char)*(undefined8 *)(in_RDI + 0x1d8));
    QIODevice::putChar((char)*(undefined8 *)(in_RDI + 0x1d8));
    QIODevice::putChar((char)*(undefined8 *)(in_RDI + 0x1d8));
    QIODevice::putChar((char)*(undefined8 *)(in_RDI + 0x1d8));
  }
  else {
    tmp = (quint8)((ulong)in_RDI >> 0x38);
    if (*(int *)(in_RDI + 400) == 0) {
      writeChar((RCCResourceLibrary *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),tmp);
      writeChar((RCCResourceLibrary *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),tmp);
      writeChar((RCCResourceLibrary *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),tmp);
      writeChar((RCCResourceLibrary *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),tmp);
    }
    else {
      writeHex((RCCResourceLibrary *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),tmp);
      writeHex((RCCResourceLibrary *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),tmp);
      writeHex((RCCResourceLibrary *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),tmp);
      writeHex((RCCResourceLibrary *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),tmp);
    }
  }
  return;
}

Assistant:

void RCCResourceLibrary::writeNumber4(quint32 number)
{
    if (m_format == RCCResourceLibrary::Pass2) {
        m_outDevice->putChar(char(number >> 24));
        m_outDevice->putChar(char(number >> 16));
        m_outDevice->putChar(char(number >> 8));
        m_outDevice->putChar(char(number));
    } else if (m_format == RCCResourceLibrary::Binary) {
        writeChar(number >> 24);
        writeChar(number >> 16);
        writeChar(number >> 8);
        writeChar(number);
    } else {
        writeHex(number >> 24);
        writeHex(number >> 16);
        writeHex(number >> 8);
        writeHex(number);
    }
}